

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spivotL.c
# Opt level: O0

int spivotL(int jcol,double u,int *usepr,int *perm_r,int *iperm_r,int *iperm_c,int *pivrow,
           GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  undefined4 uVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int_t iVar5;
  flops_t *pfVar6;
  int_t *piVar7;
  void *pvVar8;
  int iVar9;
  int iVar10;
  flops_t *ops;
  int_t *xlusup;
  float *lusup;
  int_t *xlsub;
  int_t *lsub;
  int_t itemp;
  int_t k;
  int_t icol;
  int_t isub;
  int_t *lsub_ptr;
  float *lu_col_ptr;
  float *lu_sup_ptr;
  float temp;
  float thresh;
  float rtemp;
  float pivmax;
  int diagind;
  int diag;
  int old_pivptr;
  int pivptr;
  int_t lptr;
  int nsupr;
  int nsupc;
  int fsupc;
  int *pivrow_local;
  int *iperm_c_local;
  int *iperm_r_local;
  int *perm_r_local;
  int *usepr_local;
  double u_local;
  int jcol_local;
  
  pfVar6 = stat->ops;
  piVar7 = Glu->lsub;
  pvVar8 = Glu->lusup;
  iVar3 = Glu->xsup[Glu->supno[jcol]];
  lsub._4_4_ = jcol - iVar3;
  iVar10 = Glu->xlsub[iVar3];
  iVar9 = Glu->xlsub[iVar3 + 1] - iVar10;
  iVar3 = Glu->xlusup[iVar3];
  iVar4 = Glu->xlusup[jcol];
  if (*usepr != 0) {
    *pivrow = iperm_r[jcol];
  }
  thresh = 0.0;
  pivmax = -NAN;
  diagind = lsub._4_4_;
  diag = lsub._4_4_;
  for (k = lsub._4_4_; k < iVar9; k = k + 1) {
    fVar2 = ABS(*(float *)((long)pvVar8 + (long)k * 4 + (long)iVar4 * 4));
    if (thresh < fVar2) {
      diag = k;
      thresh = fVar2;
    }
    if ((*usepr != 0) && (piVar7[(long)iVar10 + (long)k] == *pivrow)) {
      diagind = k;
    }
    if (piVar7[(long)iVar10 + (long)k] == iperm_c[jcol]) {
      pivmax = (float)k;
    }
  }
  if ((thresh != 0.0) || (NAN(thresh))) {
    if (*usepr != 0) {
      fVar2 = ABS(*(float *)((long)pvVar8 + (long)diagind * 4 + (long)iVar4 * 4));
      if (((fVar2 == 0.0) && (!NAN(fVar2))) || (fVar2 < (float)(u * (double)thresh))) {
        *usepr = 0;
      }
      else {
        diag = diagind;
      }
    }
    if (*usepr == 0) {
      if (-1 < (int)pivmax) {
        fVar2 = ABS(*(float *)((long)pvVar8 + (long)(int)pivmax * 4 + (long)iVar4 * 4));
        if (((fVar2 != 0.0) || (NAN(fVar2))) && ((float)(u * (double)thresh) <= fVar2)) {
          diag = (int)pivmax;
        }
      }
      *pivrow = piVar7[(long)iVar10 + (long)diag];
    }
    perm_r[*pivrow] = jcol;
    if (diag != lsub._4_4_) {
      iVar5 = piVar7[(long)iVar10 + (long)diag];
      piVar7[(long)iVar10 + (long)diag] = piVar7[(long)iVar10 + (long)lsub._4_4_];
      piVar7[(long)iVar10 + (long)lsub._4_4_] = iVar5;
      for (itemp = 0; itemp <= lsub._4_4_; itemp = itemp + 1) {
        iVar10 = diag + itemp * iVar9;
        uVar1 = *(undefined4 *)((long)pvVar8 + (long)iVar10 * 4 + (long)iVar3 * 4);
        *(undefined4 *)((long)pvVar8 + (long)iVar10 * 4 + (long)iVar3 * 4) =
             *(undefined4 *)
              ((long)pvVar8 + (long)(lsub._4_4_ + itemp * iVar9) * 4 + (long)iVar3 * 4);
        *(undefined4 *)((long)pvVar8 + (long)(lsub._4_4_ + itemp * iVar9) * 4 + (long)iVar3 * 4) =
             uVar1;
      }
    }
    pfVar6[7] = (float)(iVar9 - lsub._4_4_) + pfVar6[7];
    fVar2 = *(float *)((long)pvVar8 + (long)lsub._4_4_ * 4 + (long)iVar4 * 4);
    while (lsub._4_4_ = lsub._4_4_ + 1, lsub._4_4_ < iVar9) {
      *(float *)((long)pvVar8 + (long)lsub._4_4_ * 4 + (long)iVar4 * 4) =
           (1.0 / fVar2) * *(float *)((long)pvVar8 + (long)lsub._4_4_ * 4 + (long)iVar4 * 4);
    }
    u_local._4_4_ = 0;
  }
  else {
    *usepr = 0;
    u_local._4_4_ = jcol + 1;
  }
  return u_local._4_4_;
}

Assistant:

int
spivotL(
        const int  jcol,     /* in */
        const double u,      /* in - diagonal pivoting threshold */
        int        *usepr,   /* re-use the pivot sequence given by perm_r/iperm_r */
        int        *perm_r,  /* may be modified */
        int        *iperm_r, /* in - inverse of perm_r */
        int        *iperm_c, /* in - used to find diagonal of Pc*A*Pc' */
        int        *pivrow,  /* out */
        GlobalLU_t *Glu,     /* modified - global LU data structures */
	SuperLUStat_t *stat  /* output */
       )
{

    int          fsupc;	    /* first column in the supernode */
    int          nsupc;	    /* no of columns in the supernode */
    int          nsupr;     /* no of rows in the supernode */
    int_t        lptr;	    /* points to the starting subscript of the supernode */
    int          pivptr, old_pivptr, diag, diagind;
    float       pivmax, rtemp, thresh;
    float       temp;
    float       *lu_sup_ptr; 
    float       *lu_col_ptr;
    int_t        *lsub_ptr;
    int_t        isub, icol, k, itemp;
    int_t        *lsub, *xlsub;
    float       *lusup;
    int_t        *xlusup;
    flops_t      *ops = stat->ops;

    /* Initialize pointers */
    lsub       = Glu->lsub;
    xlsub      = Glu->xlsub;
    lusup      = (float *) Glu->lusup;
    xlusup     = Glu->xlusup;
    fsupc      = (Glu->xsup)[(Glu->supno)[jcol]];
    nsupc      = jcol - fsupc;	        /* excluding jcol; nsupc >= 0 */
    lptr       = xlsub[fsupc];
    nsupr      = xlsub[fsupc+1] - lptr;
    lu_sup_ptr = &lusup[xlusup[fsupc]];	/* start of the current supernode */
    lu_col_ptr = &lusup[xlusup[jcol]];	/* start of jcol in the supernode */
    lsub_ptr   = &lsub[lptr];	/* start of row indices of the supernode */

#ifdef DEBUG
if ( jcol == MIN_COL ) {
    printf("Before cdiv: col %d\n", jcol);
    for (k = nsupc; k < nsupr; k++) 
	printf("  lu[%d] %f\n", lsub_ptr[k], lu_col_ptr[k]);
}
#endif
    
    /* Determine the largest abs numerical value for partial pivoting;
       Also search for user-specified pivot, and diagonal element. */
    if ( *usepr ) *pivrow = iperm_r[jcol];
    diagind = iperm_c[jcol];
    pivmax = 0.0;
    pivptr = nsupc;
    diag = SLU_EMPTY;
    old_pivptr = nsupc;
    for (isub = nsupc; isub < nsupr; ++isub) {
	rtemp = fabs (lu_col_ptr[isub]);
	if ( rtemp > pivmax ) {
	    pivmax = rtemp;
	    pivptr = isub;
	}
	if ( *usepr && lsub_ptr[isub] == *pivrow ) old_pivptr = isub;
	if ( lsub_ptr[isub] == diagind ) diag = isub;
    }

    /* Test for singularity */
    if ( pivmax == 0.0 ) {
#if 0
        // There is no valid pivot.
        // jcol represents the rank of U, 
        // report the rank, let dgstrf handle the pivot
	*pivrow = lsub_ptr[pivptr];
	perm_r[*pivrow] = jcol;
#endif
	*usepr = 0;
	return (jcol+1);
    }

    thresh = u * pivmax;
    
    /* Choose appropriate pivotal element by our policy. */
    if ( *usepr ) {
        rtemp = fabs (lu_col_ptr[old_pivptr]);
	if ( rtemp != 0.0 && rtemp >= thresh )
	    pivptr = old_pivptr;
	else
	    *usepr = 0;
    }
    if ( *usepr == 0 ) {
	/* Use diagonal pivot? */
	if ( diag >= 0 ) { /* diagonal exists */
	    rtemp = fabs (lu_col_ptr[diag]);
	    if ( rtemp != 0.0 && rtemp >= thresh ) pivptr = diag;
        }
	*pivrow = lsub_ptr[pivptr];
    }
    
    /* Record pivot row */
    perm_r[*pivrow] = jcol;
    
    /* Interchange row subscripts */
    if ( pivptr != nsupc ) {
	itemp = lsub_ptr[pivptr];
	lsub_ptr[pivptr] = lsub_ptr[nsupc];
	lsub_ptr[nsupc] = itemp;

	/* Interchange numerical values as well, for the whole snode, such 
	 * that L is indexed the same way as A.
 	 */
	for (icol = 0; icol <= nsupc; icol++) {
	    itemp = pivptr + icol * nsupr;
	    temp = lu_sup_ptr[itemp];
	    lu_sup_ptr[itemp] = lu_sup_ptr[nsupc + icol*nsupr];
	    lu_sup_ptr[nsupc + icol*nsupr] = temp;
	}
    } /* if */

    /* cdiv operation */
    ops[FACT] += nsupr - nsupc;

    temp = 1.0 / lu_col_ptr[nsupc];
    for (k = nsupc+1; k < nsupr; k++) 
	lu_col_ptr[k] *= temp;

    return 0;
}